

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void kwsysProcessDestroy(cmsysProcess *cp)

{
  int iVar1;
  __pid_t _Var2;
  int *piVar3;
  char *__src;
  bool bVar4;
  undefined1 local_118 [4];
  int result;
  sigset_t old_mask;
  sigset_t mask;
  int i;
  cmsysProcess *cp_local;
  
  sigemptyset((sigset_t *)(old_mask.__val + 0xf));
  sigaddset((sigset_t *)(old_mask.__val + 0xf),2);
  sigaddset((sigset_t *)(old_mask.__val + 0xf),0xf);
  iVar1 = sigprocmask(0,(sigset_t *)(old_mask.__val + 0xf),(sigset_t *)local_118);
  if (-1 < iVar1) {
    for (mask.__val[0xf]._4_4_ = 0; mask.__val[0xf]._4_4_ < cp->NumberOfCommands;
        mask.__val[0xf]._4_4_ = mask.__val[0xf]._4_4_ + 1) {
      if (cp->ForkPIDs[mask.__val[0xf]._4_4_] != 0) {
        do {
          _Var2 = waitpid(cp->ForkPIDs[mask.__val[0xf]._4_4_],
                          cp->CommandExitCodes + mask.__val[0xf]._4_4_,1);
          bVar4 = false;
          if (_Var2 < 0) {
            piVar3 = __errno_location();
            bVar4 = *piVar3 == 4;
          }
        } while (bVar4);
        if (_Var2 < 1) {
          if ((_Var2 < 0) && (cp->State != 1)) {
            piVar3 = __errno_location();
            __src = strerror(*piVar3);
            strncpy(cp->ErrorMessage,__src,0x400);
            cp->State = 1;
          }
        }
        else {
          cp->ForkPIDs[mask.__val[0xf]._4_4_] = 0;
          iVar1 = cp->CommandsLeft + -1;
          cp->CommandsLeft = iVar1;
          if (iVar1 == 0) {
            kwsysProcessCleanupDescriptor(&cp->SignalPipe);
          }
        }
      }
    }
    sigprocmask(2,(sigset_t *)local_118,(sigset_t *)0x0);
  }
  return;
}

Assistant:

static void kwsysProcessDestroy(kwsysProcess* cp)
{
  /* A child process has terminated.  Reap it if it is one handled by
     this object.  */
  int i;
  /* Temporarily disable signals that access ForkPIDs.  We don't want them to
     read a reaped PID, and writes to ForkPIDs are not atomic.  */
  sigset_t mask, old_mask;
  sigemptyset(&mask);
  sigaddset(&mask, SIGINT);
  sigaddset(&mask, SIGTERM);
  if(sigprocmask(SIG_BLOCK, &mask, &old_mask) < 0)
    {
    return;
    }

  for(i=0; i < cp->NumberOfCommands; ++i)
    {
    if(cp->ForkPIDs[i])
      {
      int result;
      while(((result = waitpid(cp->ForkPIDs[i],
                               &cp->CommandExitCodes[i], WNOHANG)) < 0) &&
            (errno == EINTR));
      if(result > 0)
        {
        /* This child has termianted.  */
        cp->ForkPIDs[i] = 0;
        if(--cp->CommandsLeft == 0)
          {
          /* All children have terminated.  Close the signal pipe
             write end so that no more notifications are sent to this
             object.  */
          kwsysProcessCleanupDescriptor(&cp->SignalPipe);

          /* TODO: Once the children have terminated, switch
             WaitForData to use a non-blocking read to get the
             rest of the data from the pipe.  This is needed when
             grandchildren keep the output pipes open.  */
          }
        }
      else if(result < 0 && cp->State != kwsysProcess_State_Error)
        {
        /* Unexpected error.  Report the first time this happens.  */
        strncpy(cp->ErrorMessage, strerror(errno), KWSYSPE_PIPE_BUFFER_SIZE);
        cp->State = kwsysProcess_State_Error;
        }
      }
    }

  /* Re-enable signals.  */
  sigprocmask(SIG_SETMASK, &old_mask, 0);
}